

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O2

void __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::
emplace<llvm::DWARFDebugNames::Entry>
          (OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *this,Entry *args)

{
  reset(this);
  DWARFDebugNames::Entry::Entry((Entry *)this,args);
  this->hasVal = true;
  return;
}

Assistant:

void emplace(Args &&... args) {
    reset();
    ::new ((void *)std::addressof(value)) T(std::forward<Args>(args)...);
    hasVal = true;
  }